

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

int handle_subfields(FFSBuffer buf,FMFormat_conflict f,estate s,size_t data_offset)

{
  FMTypeEnum FVar1;
  int iVar2;
  FMTypeDesc *pFVar3;
  long lVar4;
  FMTypeDesc *t;
  
  if ((f->variant != 0) && (iVar2 = f->field_count, 0 < iVar2)) {
    lVar4 = 0;
    do {
      t = &f->var_list[lVar4].type_desc;
      for (pFVar3 = t; FVar1 = pFVar3->type, FVar1 == FMType_array; pFVar3 = pFVar3->next) {
      }
      if (FVar1 == FMType_subformat) {
        if (f->field_subformats[pFVar3->field_index]->variant != 0) goto LAB_0010e1c2;
      }
      else if (FVar1 != FMType_simple) {
LAB_0010e1c2:
        iVar2 = handle_subfield(buf,f,s,(long)f->field_list[lVar4].field_offset + data_offset,
                                data_offset,t);
        if (iVar2 != 1) {
          return 0;
        }
        iVar2 = f->field_count;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return 1;
}

Assistant:

static int
handle_subfields(FFSBuffer buf, FMFormat f, estate s, size_t data_offset)
{
    int i;
    /* if base is not variant (I.E. doesn't contain addresses), return;*/
    if (!f->variant) return 1;

    for (i = 0; i < f->field_count; i++) {
	size_t subfield_offset = data_offset + f->field_list[i].field_offset;
	int ret;
	if (field_is_flat(f, &f->var_list[i].type_desc)) continue;
	ret = handle_subfield(buf, f, s, subfield_offset, data_offset, 
			      &f->var_list[i].type_desc);
	if (ret != 1) return 0;
    }
    return 1;
}